

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

void mjs::throw_runtime_error(string_view *s,char *file,int line)

{
  size_t sVar1;
  ostream *poVar2;
  runtime_error *this;
  ostringstream oss;
  undefined1 auStack_1b8 [8];
  string local_1b0 [32];
  long local_190 [47];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  if (file == (char *)0x0) {
    std::ios::clear((int)auStack_1b8 + (int)*(undefined8 *)(local_190[0] + -0x18) + 0x28);
  }
  else {
    sVar1 = strlen(file);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,file,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_190,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,s->_M_str,s->_M_len);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

[[noreturn]] void throw_runtime_error(const std::string_view& s, const char* file, int line) {
    std::ostringstream oss;
    oss << file << ":" << line << ": " << s;
    throw std::runtime_error(oss.str());
}